

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O1

int32_t __thiscall
duckdb::StrpTimeFormat::TryParseCollection
          (StrpTimeFormat *this,char *data,idx_t *pos,idx_t size,string_t *collection,
          idx_t collection_count)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  idx_t iVar8;
  char *pcVar9;
  ulong uVar10;
  int32_t local_6c;
  
  if (collection_count != 0) {
    uVar5 = *pos;
    iVar8 = 0;
    do {
      uVar10 = (ulong)collection[iVar8].value.pointer.length;
      if (uVar10 < 0xd) {
        pcVar9 = collection[iVar8].value.pointer.prefix;
      }
      else {
        pcVar9 = collection[iVar8].value.pointer.ptr;
      }
      uVar1 = uVar5 + uVar10;
      bVar2 = false;
      if (uVar1 <= size) {
        if (uVar10 == 0) {
          uVar7 = 0;
        }
        else {
          uVar6 = 0;
          do {
            iVar3 = tolower((int)pcVar9[uVar6]);
            iVar4 = tolower((int)data[uVar6 + uVar5]);
            uVar7 = uVar6;
            if (iVar3 != iVar4) break;
            uVar6 = uVar6 + 1;
            uVar7 = uVar10;
          } while (uVar10 != uVar6);
        }
        bVar2 = false;
        if (uVar7 == uVar10) {
          *pos = uVar1;
          bVar2 = true;
          local_6c = (int32_t)iVar8;
          uVar5 = uVar1;
        }
      }
      if (bVar2) {
        return local_6c;
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != collection_count);
  }
  return -1;
}

Assistant:

int32_t StrpTimeFormat::TryParseCollection(const char *data, idx_t &pos, idx_t size, const string_t collection[],
                                           idx_t collection_count) const {
	for (idx_t c = 0; c < collection_count; c++) {
		auto &entry = collection[c];
		auto entry_data = entry.GetData();
		auto entry_size = entry.GetSize();
		// check if this entry matches
		if (pos + entry_size > size) {
			// too big: can't match
			continue;
		}
		// compare the characters
		idx_t i;
		for (i = 0; i < entry_size; i++) {
			if (std::tolower(entry_data[i]) != std::tolower(data[pos + i])) {
				break;
			}
		}
		if (i == entry_size) {
			// full match
			pos += entry_size;
			return UnsafeNumericCast<int32_t>(c);
		}
	}
	return -1;
}